

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjFixup::CVmObjFixup(CVmObjFixup *this,ulong entry_cnt)

{
  obj_fixup_entry **ppoVar1;
  obj_fixup_entry *poVar2;
  uint uVar3;
  size_t __size;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->cnt_ = entry_cnt;
  this->used_ = 0;
  if (entry_cnt == 0) {
    this->arr_ = (obj_fixup_entry **)0x0;
    this->pages_ = 0;
  }
  else {
    uVar6 = entry_cnt + 0x7ff >> 0xb;
    this->pages_ = uVar6;
    ppoVar1 = (obj_fixup_entry **)malloc(uVar6 * 8);
    this->arr_ = ppoVar1;
    if (0x7ff < entry_cnt + 0x7ff) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar5 = (ulong)uVar3;
        __size = (ulong)((int)entry_cnt * 8 + 0x3ff8U & 0x3ff8) + 8;
        if (uVar6 != uVar5) {
          __size = 0x4000;
        }
        poVar2 = (obj_fixup_entry *)malloc(__size);
        this->arr_[uVar4] = poVar2;
        uVar6 = this->pages_;
        uVar3 = uVar3 + 1;
        uVar4 = uVar5;
      } while (uVar5 < uVar6);
    }
  }
  return;
}

Assistant:

CVmObjFixup::CVmObjFixup(ulong entry_cnt)
{
    uint i;

    /* remember the number of entries */
    cnt_ = entry_cnt;
    
    /* no entries are used yet */
    used_ = 0;
    
    /* if we have no entries, there's nothing to do */
    if (cnt_ == 0)
    {
        arr_ = 0;
        pages_ = 0;
        return;
    }

    /* calculate the number of subarrays we need */
    pages_ = (entry_cnt + VMOBJFIXUP_SUB_SIZE - 1) / VMOBJFIXUP_SUB_SIZE;
    
    /* allocate the necessary number of subarrays */
    arr_ = (obj_fixup_entry **)t3malloc(pages_ * sizeof(arr_[0]));
    
    /* allocate the subarrays */
    for (i = 0 ; i < pages_ ; ++i)
    {
        size_t cur_cnt;
        
        /* 
         *   allocate a full page, except for the last page, which might be
         *   only partially used 
         */
        cur_cnt = VMOBJFIXUP_SUB_SIZE;
        if (i + 1 == pages_)
            cur_cnt = ((entry_cnt - 1) % VMOBJFIXUP_SUB_SIZE) + 1;
        
        /* allocate it */
        arr_[i] = (obj_fixup_entry *)t3malloc(cur_cnt * sizeof(arr_[i][i]));
    }
}